

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

void __thiscall
HashCallback<Blob<128>_>::operator()(HashCallback<Blob<128>_> *this,void *key,int len)

{
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *this_00;
  Blob<128> h;
  Blob<128> local_30;
  
  this_00 = this->m_hashes;
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::resize
            (this_00,((long)(this_00->super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this_00->super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 4) + 1);
  Blob<128>::Blob(&local_30);
  (*this->m_pfHash)(key,len,0,&local_30);
  Blob<128>::operator=
            ((this->m_hashes->super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>)._M_impl.
             super__Vector_impl_data._M_finish + -1,&local_30);
  return;
}

Assistant:

virtual void operator () ( const void * key, int len )
  {
    size_t newsize = m_hashes.size() + 1;

    m_hashes.resize(newsize);

    hashtype h;
    m_pfHash(key, len, 0, &h);
    m_hashes.back() = h;
  }